

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ConditionalPredicateSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConditionalPredicateSyntax,slang::syntax::SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax>&>
          (BumpAllocator *this,SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax> *args)

{
  ConditionalPredicateSyntax *pCVar1;
  size_t in_RDI;
  size_t unaff_retaddr;
  SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax> *in_stack_00000018;
  ConditionalPredicateSyntax *in_stack_00000020;
  
  pCVar1 = (ConditionalPredicateSyntax *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::ConditionalPredicateSyntax::ConditionalPredicateSyntax
            (in_stack_00000020,in_stack_00000018);
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }